

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

uint __thiscall crnlib::dxt3_block::get_alpha(dxt3_block *this,uint x,uint y,bool scaled)

{
  byte bVar1;
  uint local_20;
  uint value;
  bool scaled_local;
  uint y_local;
  uint x_local;
  dxt3_block *this_local;
  
  bVar1 = this->m_alpha[y * 2 + (x >> 1)];
  if ((x & 1) != 0) {
    bVar1 = bVar1 >> 4;
  }
  local_20 = (uint)bVar1;
  local_20 = local_20 & 0xf;
  if (scaled) {
    local_20 = local_20 << 4 | local_20;
  }
  return local_20;
}

Assistant:

uint dxt3_block::get_alpha(uint x, uint y, bool scaled) const
    {
        CRNLIB_ASSERT((x < cDXTBlockSize) && (y < cDXTBlockSize));

        uint value = m_alpha[(y << 1U) + (x >> 1U)];
        if (x & 1)
        {
            value >>= 4;
        }
        value &= 0xF;

        if (scaled)
        {
            value = (value << 4U) | value;
        }

        return value;
    }